

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicFileSystem.cpp
# Opt level: O1

string * __thiscall
Diligent::BasicFileSystem::SimplifyPath_abi_cxx11_
          (string *__return_storage_ptr__,BasicFileSystem *this,Char *Path,Char Slash)

{
  BasicFileSystem *pBVar1;
  BasicFileSystem BVar2;
  BasicFileSystem BVar3;
  pointer pMVar4;
  bool bVar5;
  int iVar6;
  pointer pMVar7;
  ulong uVar8;
  pointer pMVar9;
  undefined7 in_register_00000009;
  MiniStringView *Cmp;
  long lVar10;
  ulong uVar11;
  char (*Args_1) [31];
  char cVar12;
  size_t __n;
  char *pcVar13;
  BasicFileSystem *pBVar14;
  char (*pacVar15) [31];
  pointer pMVar16;
  BasicFileSystem *pBVar17;
  long lVar18;
  _Vector_base<MiniStringView,_std::allocator<MiniStringView>_> *p_Var19;
  pointer pMVar20;
  const_iterator __end1;
  pointer pMVar21;
  char **ppcVar22;
  string msg;
  string local_50;
  
  Cmp = (MiniStringView *)CONCAT71(in_register_00000009,Slash);
  if (this == (BasicFileSystem *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"","",Cmp);
    return __return_storage_ptr__;
  }
  cVar12 = (char)Path;
  pBVar14 = this;
  if (cVar12 == '\0') {
    cVar12 = '/';
  }
  else if ((cVar12 != '/') && (cVar12 != '\\')) {
    FormatString<char[23]>(&local_50,(char (*) [23])"Incorrect slash symbol");
    pcVar13 = "SimplifyPath";
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"SimplifyPath",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Platforms/Basic/src/BasicFileSystem.cpp"
               ,0xea);
    pBVar14 = (BasicFileSystem *)pcVar13;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      pBVar14 = (BasicFileSystem *)(local_50.field_2._M_allocated_capacity + 1);
      operator_delete(local_50._M_dataplus._M_p,(ulong)pBVar14);
    }
  }
  pBVar17 = this + 1;
  p_Var19 = (_Vector_base<MiniStringView,_std::allocator<MiniStringView>_> *)0x1;
  do {
    BVar2 = pBVar17[-1];
    if ((BVar2 == (BasicFileSystem)0x2f) || (BVar2 == (BasicFileSystem)0x5c)) {
      p_Var19 = (_Vector_base<MiniStringView,_std::allocator<MiniStringView>_> *)
                ((long)&(p_Var19->_M_impl).super__Vector_impl_data._M_start +
                (ulong)(*pBVar17 != (BasicFileSystem)0x5c && *pBVar17 != (BasicFileSystem)0x2f));
    }
    else if (BVar2 == (BasicFileSystem)0x0) break;
    pBVar17 = pBVar17 + 1;
  } while( true );
  if ((ulong)p_Var19 >> 0x3b != 0) {
    std::__throw_length_error("vector::reserve");
  }
  if (p_Var19 == (_Vector_base<MiniStringView,_std::allocator<MiniStringView>_> *)0x0) {
    pMVar7 = (pointer)0x0;
    pMVar20 = (pointer)0x0;
  }
  else {
    pMVar7 = std::_Vector_base<MiniStringView,_std::allocator<MiniStringView>_>::_M_allocate
                       (p_Var19,(size_t)pBVar14);
    pMVar20 = pMVar7 + (long)p_Var19;
  }
  BVar2 = *this;
  pBVar17 = this;
  pMVar16 = pMVar7;
  pMVar4 = pMVar7;
  while (BVar2 != (BasicFileSystem)0x0) {
    for (; (BVar2 = *pBVar17, BVar2 == (BasicFileSystem)0x2f || (BVar2 == (BasicFileSystem)0x5c));
        pBVar17 = pBVar17 + 1) {
    }
    if (BVar2 == (BasicFileSystem)0x0) break;
    for (lVar10 = 0;
        ((BVar3 = pBVar17[lVar10], BVar3 != (BasicFileSystem)0x0 && (BVar3 != (BasicFileSystem)0x2f)
         ) && (BVar3 != (BasicFileSystem)0x5c)); lVar10 = lVar10 + 1) {
    }
    pBVar14 = (BasicFileSystem *)
              CONCAT71((int7)((ulong)pBVar14 >> 8),BVar2 == (BasicFileSystem)0x2e);
    pBVar1 = pBVar17 + lVar10;
    pMVar21 = pMVar4;
    if (BVar2 != (BasicFileSystem)0x2e || lVar10 != 1) {
      if (((lVar10 == 2 && BVar2 == (BasicFileSystem)0x2e) && (pBVar17[1] == (BasicFileSystem)0x2e))
         && (pMVar16 != pMVar4)) {
        pBVar14 = (BasicFileSystem *)pMVar4[-1].Start;
        __n = (long)pMVar4[-1].End - (long)pBVar14;
        iVar6 = strncmp("..",(char *)pBVar14,__n);
        pMVar21 = pMVar4 + -1;
        if ((iVar6 != 0) || (".."[__n] != '\0')) goto LAB_00732683;
      }
      if (pMVar4 == pMVar20) {
        lVar10 = (long)pMVar4 - (long)pMVar16;
        if (lVar10 == 0x7ffffffffffffff0) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar8 = lVar10 >> 4;
        uVar11 = uVar8;
        if (pMVar4 == pMVar16) {
          uVar11 = 1;
        }
        p_Var19 = (_Vector_base<MiniStringView,_std::allocator<MiniStringView>_> *)(uVar11 + uVar8);
        if ((_Vector_base<MiniStringView,_std::allocator<MiniStringView>_> *)0x7fffffffffffffe <
            p_Var19) {
          p_Var19 = (_Vector_base<MiniStringView,_std::allocator<MiniStringView>_> *)
                    0x7ffffffffffffff;
        }
        if (CARRY8(uVar11,uVar8)) {
          p_Var19 = (_Vector_base<MiniStringView,_std::allocator<MiniStringView>_> *)
                    0x7ffffffffffffff;
        }
        pMVar7 = std::_Vector_base<MiniStringView,_std::allocator<MiniStringView>_>::_M_allocate
                           (p_Var19,(size_t)pBVar14);
        *(BasicFileSystem **)((long)pMVar7 + lVar10) = pBVar17;
        *(BasicFileSystem **)((long)pMVar7 + lVar10 + 8) = pBVar1;
        pMVar21 = pMVar7;
        for (pMVar9 = pMVar16; pMVar4 != pMVar9; pMVar9 = pMVar9 + 1) {
          pcVar13 = pMVar9->End;
          pMVar21->Start = pMVar9->Start;
          pMVar21->End = pcVar13;
          pMVar21 = pMVar21 + 1;
        }
        if (pMVar16 != (pointer)0x0) {
          pBVar14 = (BasicFileSystem *)((long)pMVar20 - (long)pMVar16);
          operator_delete(pMVar16,(ulong)pBVar14);
        }
        pMVar20 = pMVar7 + (long)p_Var19;
        pMVar16 = pMVar7;
        pMVar21 = pMVar21 + 1;
      }
      else {
        pMVar4->Start = (char *)pBVar17;
        pMVar4->End = (char *)pBVar1;
        pMVar21 = pMVar4 + 1;
      }
    }
LAB_00732683:
    pBVar17 = pBVar1;
    pMVar4 = pMVar21;
    BVar2 = *pBVar1;
  }
  if (cVar12 == '/') {
    bVar5 = *this == (BasicFileSystem)0x5c || *this == (BasicFileSystem)0x2f;
  }
  else {
    bVar5 = false;
  }
  lVar10 = (long)pMVar4 - (long)pMVar7 >> 4;
  pcVar13 = (char *)(ulong)bVar5;
  for (pMVar16 = pMVar7; pMVar16 != pMVar4; pMVar16 = pMVar16 + 1) {
    pcVar13 = pMVar16->End + ((long)pcVar13 - (long)pMVar16->Start);
  }
  Args_1 = (char (*) [31])0x0;
  pacVar15 = (char (*) [31])(lVar10 + -1);
  if (pMVar4 == pMVar7) {
    pacVar15 = Args_1;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  if ((char *)(ulong)bVar5 != (char *)0x0) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  if (pMVar4 != pMVar7) {
    ppcVar22 = &pMVar7->End;
    lVar18 = 0;
    do {
      if (lVar18 != 0) {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      Args_1 = (char (*) [31])((MiniStringView *)(ppcVar22 + -1))->Start;
      std::__cxx11::string::replace
                ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,(char *)0x0,
                 (ulong)Args_1);
      lVar18 = lVar18 + 1;
      ppcVar22 = ppcVar22 + 2;
    } while (lVar10 + (ulong)(lVar10 == 0) != lVar18);
  }
  if ((char *)__return_storage_ptr__->_M_string_length != *pacVar15 + (long)pcVar13) {
    FormatString<char[26],char[31]>
              (&local_50,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"SimplifiedPath.length() == Len",Args_1);
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"SimplifyPath",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Platforms/Basic/src/BasicFileSystem.cpp"
               ,0x11b);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  if (pMVar7 != (pointer)0x0) {
    operator_delete(pMVar7,(long)pMVar20 - (long)pMVar7);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string BasicFileSystem::SimplifyPath(const Char* Path, Char Slash)
{
    if (Path == nullptr)
        return "";

    if (Slash != 0)
        DEV_CHECK_ERR(IsSlash(Slash), "Incorrect slash symbol");
    else
        Slash = SlashSymbol;

    struct MiniStringView
    {
        MiniStringView(const char* _Start,
                       const char* _End) :
            Start{_Start},
            End{_End}
        {}

        bool operator==(const char* Str) const noexcept
        {
            const auto Len = End - Start;
            return strncmp(Str, Start, Len) == 0 && Str[Len] == '\0';
        }

        bool operator!=(const char* str) const noexcept
        {
            return !(*this == str);
        }

        const char* const Start;
        const char* const End;
    };

    const auto PathComponents  = Diligent::SplitPath<MiniStringView>(Path, true);
    const auto NumComponents   = PathComponents.size();
    const auto UseLeadingSlash = Slash == '/' && IsSlash(Path[0]);

    size_t Len = UseLeadingSlash ? 1 : 0;
    for (const auto& Cmp : PathComponents)
        Len += Cmp.End - Cmp.Start;
    if (NumComponents > 0)
        Len += NumComponents - 1;

    std::string SimplifiedPath;
    SimplifiedPath.reserve(Len);
    if (UseLeadingSlash)
        SimplifiedPath.push_back(Slash);

    for (size_t i = 0; i < NumComponents; ++i)
    {
        if (i > 0)
            SimplifiedPath.push_back(Slash);
        const auto& Cmp = PathComponents[i];
        SimplifiedPath.append(Cmp.Start, Cmp.End);
    }
    VERIFY_EXPR(SimplifiedPath.length() == Len);

    return SimplifiedPath;
}